

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O2

void __thiscall QEglConfigChooser::QEglConfigChooser(QEglConfigChooser *this,EGLDisplay display)

{
  this->_vptr_QEglConfigChooser = (_func_int **)&PTR__QEglConfigChooser_007886b0;
  QSurfaceFormat::QSurfaceFormat(&this->m_format);
  this->m_display = display;
  this->m_surfaceType = 4;
  this->m_ignore = false;
  this->m_confAttrRed = 0;
  this->m_confAttrGreen = 0;
  this->m_confAttrBlue = 0;
  this->m_confAttrAlpha = 0;
  return;
}

Assistant:

QEglConfigChooser::QEglConfigChooser(EGLDisplay display)
    : m_display(display)
    , m_surfaceType(EGL_WINDOW_BIT)
    , m_ignore(false)
    , m_confAttrRed(0)
    , m_confAttrGreen(0)
    , m_confAttrBlue(0)
    , m_confAttrAlpha(0)
{
}